

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>,bool(*)(testing::TestInfo_const*)>
              (vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *c,
              _func_bool_TestInfo_ptr *predicate)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_30;
  __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_28;
  const_iterator it;
  int count;
  _func_bool_TestInfo_ptr *predicate_local;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *c_local;
  
  it._M_current._4_4_ = 0;
  local_28._M_current =
       (TestInfo **)std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin(c)
  ;
  while( true ) {
    local_30._M_current =
         (TestInfo **)std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end(c)
    ;
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
              ::operator*(&local_28);
    bVar1 = (*predicate)(*ppTVar2);
    if (bVar1) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<testing::TestInfo_*const_*,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
    ::operator++(&local_28);
  }
  return it._M_current._4_4_;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (typename Container::const_iterator it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it))
      ++count;
  }
  return count;
}